

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O2

void EPD_DrawLine(uint16_t x1,uint16_t y1,uint16_t x2,uint16_t y2,uint8_t color)

{
  uint uVar1;
  short sVar2;
  uint uVar3;
  uint uVar4;
  short sVar5;
  undefined6 in_register_0000000a;
  uint uVar6;
  undefined6 in_register_00000012;
  ulong uVar7;
  ulong uVar8;
  undefined6 in_register_00000032;
  undefined6 in_register_0000003a;
  uint uVar9;
  uint uVar10;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  
  uVar7 = CONCAT62(in_register_0000003a,x1) & 0xffffffff;
  uVar3 = (int)CONCAT62(in_register_00000012,x2) - (int)CONCAT62(in_register_0000003a,x1);
  uVar9 = -uVar3;
  if (0 < (int)uVar3) {
    uVar9 = uVar3;
  }
  uVar8 = CONCAT62(in_register_00000032,y1) & 0xffffffff;
  uVar3 = (int)CONCAT62(in_register_0000000a,y2) - (int)CONCAT62(in_register_00000032,y1);
  local_44 = -uVar3;
  if (0 < (int)uVar3) {
    local_44 = uVar3;
  }
  local_3c = -(uint)(x2 < (ushort)uVar7) | 1;
  sVar2 = (short)local_3c;
  local_40 = -(uint)(y2 < (ushort)uVar8) | 1;
  sVar5 = (short)local_40;
  if (uVar9 < local_44) {
    local_40 = 0;
    sVar2 = 0;
    uVar3 = local_44;
    local_44 = uVar9;
  }
  else {
    local_3c = 0;
    sVar5 = 0;
    uVar3 = uVar9;
  }
  uVar10 = uVar3 >> 1;
  for (uVar9 = 0; uVar9 <= uVar3; uVar9 = uVar9 + 1) {
    EPD_DrawPixel((uint16_t)uVar7,(uint16_t)uVar8,color);
    uVar6 = uVar3;
    uVar1 = local_40;
    uVar4 = local_3c;
    if (uVar10 + local_44 < uVar3) {
      uVar4 = 0;
      uVar6 = 0;
      uVar1 = 0;
    }
    uVar10 = (uVar10 + local_44) - uVar6;
    uVar7 = (ulong)(((uint)uVar7 & 0xffff) + (int)sVar2 + uVar4);
    uVar8 = (ulong)(((uint)uVar8 & 0xffff) + (int)sVar5 + uVar1);
  }
  return;
}

Assistant:

void EPD_DrawLine(uint16_t x1,uint16_t y1,uint16_t x2,uint16_t y2,uint8_t color)
{
	  uint32_t deltax = 0, deltay = 0, x = 0, y = 0, xinc1 = 0, xinc2 = 0, 
	  yinc1 = 0, yinc2 = 0, den = 0, num = 0, num_add = 0, num_pixels = 0, 
	  curpixel = 0;
	  
	  deltax = ABS(x2 - x1);        /* The difference between the x's */
	  deltay = ABS(y2 - y1);        /* The difference between the y's */
	  x = x1;                       /* Start x off at the first pixel */
	  y = y1;                       /* Start y off at the first pixel */
	  
	  if (x2 >= x1)                 /* The x-values are increasing */
	  {
		    xinc1 = 1;
		    xinc2 = 1;
	  }
	  else                          /* The x-values are decreasing */
	  {
		    xinc1 = -1;
		    xinc2 = -1;
	  }
	  
	  if (y2 >= y1)                 /* The y-values are increasing */
	  {
		    yinc1 = 1;
		    yinc2 = 1;
	  }
	  else                          /* The y-values are decreasing */
	  {
		    yinc1 = -1;
		    yinc2 = -1;
	  }
	  
	  if (deltax >= deltay)         /* There is at least one x-value for every y-value */
	  {
		    xinc1 = 0;              /* Don't change the x when numerator >= denominator */
		    yinc2 = 0;              /* Don't change the y for every iteration */
		    den = deltax;
		    num = deltax / 2;
		    num_add = deltay;
		    num_pixels = deltax;    /* There are more x-values than y-values */
	  }
	  else                          /* There is at least one y-value for every x-value */
	  {
		    xinc2 = 0;              /* Don't change the x for every iteration */
		    yinc1 = 0;              /* Don't change the y when numerator >= denominator */
		    den = deltay;
		    num = deltay / 2;
		    num_add = deltax;
		    num_pixels = deltay;    /* There are more y-values than x-values */
	  }
	  
	  for (curpixel = 0; curpixel <= num_pixels; curpixel++)
	  {
		    EPD_DrawPixel(x, y, color);          /* Draw the current pixel */
		    num += num_add;                      /* Increase the numerator by the top of the fraction */
		    if (num >= den)                      /* Check if numerator >= denominator */
		    {
			      num -= den;                    /* Calculate the new numerator value */
			      x += xinc1;                    /* Change the x as appropriate */
			      y += yinc1;                    /* Change the y as appropriate */
		    }
		    x += xinc2;                          /* Change the x as appropriate */
		    y += yinc2;                          /* Change the y as appropriate */
	  }
}